

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.h
# Opt level: O0

void __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::Dispose(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
          *this,bool isShutdown)

{
  DetachedStateBase **ppDVar1;
  DetachedStateBase *this_00;
  bool isShutdown_local;
  JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
  *this_local;
  
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DetachedStateBase__
                      ((WriteBarrierPtr *)&this->mappedSerializedScriptValue);
  if (*ppDVar1 != (DetachedStateBase *)0x0) {
    this_00 = Memory::WriteBarrierPtr<Js::DetachedStateBase>::operator->
                        (&this->mappedSerializedScriptValue);
    DetachedStateBase::CleanUp(this_00);
  }
  return;
}

Assistant:

virtual void Dispose(bool isShutdown) override
        {
#ifndef NTBUILD
            if (this->mappedSerializedScriptValue != nullptr)
            {
                // We have to extend the buffer data's lifetime until Dispose because
                // it might be used during finalization of other objects, such as
                // FunctionEntryPointInfo which wants to log its name.
                this->mappedSerializedScriptValue->CleanUp();
            }
#endif
        }